

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O2

int Map_NodeReadRefPhaseAct(Map_Node_t *pNode,int fPhase)

{
  uint __line;
  int *piVar1;
  char *__assertion;
  
  if (((ulong)pNode & 1) != 0) {
    __assertion = "!Map_IsComplement(pNode)";
    __line = 0x2d;
LAB_0030ebe3:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperRefs.c"
                  ,__line,"int Map_NodeReadRefPhaseAct(Map_Node_t *, int)");
  }
  if (pNode->pCutBest[0] == (Map_Cut_t *)0x0) {
    if (pNode->pCutBest[1] == (Map_Cut_t *)0x0) {
      __assertion = "pNode->pCutBest[0] || pNode->pCutBest[1]";
      __line = 0x30;
      goto LAB_0030ebe3;
    }
  }
  else if (pNode->pCutBest[1] != (Map_Cut_t *)0x0) {
    piVar1 = pNode->nRefAct + fPhase;
    goto LAB_0030ebaf;
  }
  piVar1 = pNode->nRefAct + 2;
LAB_0030ebaf:
  return *piVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the actual reference counter of a phase.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Map_NodeReadRefPhaseAct( Map_Node_t * pNode, int fPhase )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] ) // both assigned
        return pNode->nRefAct[fPhase];
    assert( pNode->pCutBest[0] || pNode->pCutBest[1] ); // at least one assigned
    return pNode->nRefAct[2];
}